

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlrole.c
# Opt level: O1

int prolog2(PROLOG_STATE *state,int tok,char *ptr,char *end,ENCODING *enc)

{
  switch(tok - 0xbU >> 1 | (uint)((tok - 0xbU & 1) != 0) << 0x1f) {
  case 0:
    return 0x37;
  case 1:
    return 0x38;
  case 2:
    return 0;
  case 9:
    state->handler = error;
    return 2;
  }
  if ((tok == 0x1c) && (state->documentEntity == 0)) {
    return 0x3b;
  }
  state->handler = error;
  return -1;
}

Assistant:

static int PTRCALL
prolog2(PROLOG_STATE *state, int tok, const char *ptr, const char *end,
        const ENCODING *enc) {
  UNUSED_P(ptr);
  UNUSED_P(end);
  UNUSED_P(enc);
  switch (tok) {
  case XML_TOK_PROLOG_S:
    return XML_ROLE_NONE;
  case XML_TOK_PI:
    return XML_ROLE_PI;
  case XML_TOK_COMMENT:
    return XML_ROLE_COMMENT;
  case XML_TOK_INSTANCE_START:
    state->handler = error;
    return XML_ROLE_INSTANCE_START;
  }
  return common(state, tok);
}